

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readpsm.c
# Opt level: O0

int it_pattern_compare(IT_PATTERN *p1,IT_PATTERN *p2)

{
  int iVar1;
  IT_ENTRY *pIVar2;
  long in_RSI;
  long in_RDI;
  IT_ENTRY *e2;
  IT_ENTRY *end;
  IT_ENTRY *e1;
  IT_ENTRY *local_30;
  IT_ENTRY *local_20;
  int local_4;
  
  if (in_RDI == in_RSI) {
    local_4 = 1;
  }
  else if (*(int *)(in_RDI + 4) == *(int *)(in_RSI + 4)) {
    local_20 = *(IT_ENTRY **)(in_RDI + 8);
    pIVar2 = local_20 + *(int *)(in_RDI + 4);
    local_30 = *(IT_ENTRY **)(in_RSI + 8);
    for (; local_20 < pIVar2; local_20 = local_20 + 1) {
      iVar1 = it_entry_compare(local_20,local_30);
      if (iVar1 == 0) {
        return 0;
      }
      local_30 = local_30 + 1;
    }
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int it_pattern_compare(const IT_PATTERN * p1, const IT_PATTERN * p2) {
	IT_ENTRY * e1, * end;
	IT_ENTRY * e2;

	if (p1 == p2) return 1;
	if (p1->n_entries != p2->n_entries) return 0;
	
	e1 = p1->entry; end = e1 + p1->n_entries;
	e2 = p2->entry;

	while (e1 < end) {
		if (!it_entry_compare(e1, e2)) return 0;
		e1++; e2++;
	}

	return 1;
}